

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

upb_EncodeStatus
upb_Encode(upb_Message *msg,upb_MiniTable *l,int options,upb_Arena *arena,char **buf,size_t *size)

{
  upb_EncodeStatus uVar1;
  
  uVar1 = _upb_Encode(msg,l,options,arena,buf,size,false);
  return uVar1;
}

Assistant:

upb_EncodeStatus upb_Encode(const upb_Message* msg, const upb_MiniTable* l,
                            int options, upb_Arena* arena, char** buf,
                            size_t* size) {
  return _upb_Encode(msg, l, options, arena, buf, size, false);
}